

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

bool __thiscall
Clasp::DefaultMinimize::commitLowerBound(DefaultMinimize *this,Solver *s,bool upShared)

{
  uint uVar1;
  uint uVar2;
  SharedData *pSVar3;
  wsum_t wVar4;
  bool bVar5;
  long low;
  uint32 x;
  uint at;
  bool bVar6;
  
  bVar6 = true;
  if ((*this->bounds_ != 0x7fffffffffffffff) &&
     (pSVar3 = (this->super_MinimizeConstraint).shared_, pSVar3->mode_ != enumerate)) {
    bVar6 = (pSVar3->gCount_).super___atomic_base<unsigned_int>._M_i == pSVar3->optGen_;
  }
  uVar1 = this->size_;
  uVar2 = *(uint *)&(this->step_).field_0x4;
  at = uVar2 & 0x3fffffff;
  if (at < uVar1) {
    bVar5 = at != uVar1 - 1 || 1 < (this->step_).size;
    if ((!(bool)(bVar6 | uVar2 < 0x40000000)) && (at < uVar1)) {
      low = this->bounds_[at] + 1;
      wVar4 = low;
      if ((upShared) &&
         (wVar4 = SharedMinimizeData::incLower((this->super_MinimizeConstraint).shared_,at,low),
         wVar4 == low)) {
        (s->lower).level = at;
        (s->lower).bound = (((this->super_MinimizeConstraint).shared_)->adjust_).ebo_.buf[at] + low;
        wVar4 = low;
      }
      this->bounds_
      [(ulong)(this->size_ * 3) + (ulong)(*(uint *)&(this->step_).field_0x4 & 0x3fffffff)] = wVar4;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DefaultMinimize::commitLowerBound(Solver& s, bool upShared) {
	bool act  = active() && shared_->checkNext();
	bool more = step_.lev < size_ && (step_.size > 1 || step_.lev != size_-1);
	if (act && step_.type && step_.lev < size_) {
		uint32 x = step_.lev;
		wsum_t L = opt()[x] + 1;
		if (upShared) {
			wsum_t sv = shared_->incLower(x, L);
			if (sv == L) { reportLower(s, x, sv); }
			else         { L = sv; }
		}
		stepLow()= L;
		if (step_.type == OptParams::bb_inc){ step_.size = 1; }
	}
	return more;
}